

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

FilePath * testing::internal::GetCurrentExecutableName(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *pcVar3;
  long lVar4;
  FilePath *in_RDI;
  FilePath result;
  char *local_70;
  long local_68;
  char local_60 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  FilePath local_38;
  
  paVar1 = &local_38.pathname_.field_2;
  local_38.pathname_._M_string_length = 0;
  local_38.pathname_.field_2._M_local_buf[0] = '\0';
  local_38.pathname_._M_dataplus._M_p = (pointer)paVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_50,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)g_argvs_abi_cxx11_);
  pcVar2 = ((local_50.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,
             pcVar2 + (local_50.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
  pcVar3 = local_70;
  if (local_68 != 0) {
    lVar4 = 0;
    do {
      if (((local_70[lVar4] != '/') || (pcVar3 == local_70)) || (pcVar3[-1] != '/')) {
        *pcVar3 = local_70[lVar4];
        pcVar3 = pcVar3 + 1;
      }
      lVar4 = lVar4 + 1;
    } while (local_68 != lVar4);
  }
  local_68 = (long)pcVar3 - (long)local_70;
  *pcVar3 = '\0';
  std::__cxx11::string::_M_assign((string *)&local_38);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  FilePath::RemoveDirectoryName(in_RDI,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.pathname_._M_dataplus._M_p != paVar1) {
    operator_delete(local_38.pathname_._M_dataplus._M_p);
  }
  return in_RDI;
}

Assistant:

FilePath GetCurrentExecutableName() {
  FilePath result;

#if GTEST_OS_WINDOWS || GTEST_OS_OS2
  result.Set(FilePath(GetArgvs()[0]).RemoveExtension("exe"));
#else
  result.Set(FilePath(GetArgvs()[0]));
#endif  // GTEST_OS_WINDOWS

  return result.RemoveDirectoryName();
}